

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum-dtoa.cpp
# Opt level: O1

void icu_63::double_conversion::GenerateCountedDigits
               (int count,int *decimal_point,Bignum *numerator,Bignum *denominator,
               Vector<char> buffer,int *length)

{
  uint16_t uVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  
  pcVar4 = buffer.start_;
  if (1 < count) {
    uVar3 = 0;
    do {
      uVar1 = Bignum::DivideModuloIntBignum(numerator,denominator);
      pcVar4[uVar3] = (char)uVar1 + '0';
      Bignum::MultiplyByUInt32(numerator,10);
      uVar3 = uVar3 + 1;
    } while (count - 1U != uVar3);
  }
  uVar1 = Bignum::DivideModuloIntBignum(numerator,denominator);
  iVar2 = Bignum::PlusCompare(numerator,numerator,denominator);
  pcVar4[(int)(count - 1U)] = (-1 < iVar2) + (char)uVar1 + '0';
  if (1 < count) {
    uVar3 = (ulong)(uint)count;
    do {
      if (pcVar4[uVar3 - 1] != ':') break;
      pcVar4[uVar3 - 1] = '0';
      pcVar4[uVar3 - 2] = pcVar4[uVar3 - 2] + '\x01';
      uVar3 = uVar3 - 1;
    } while (1 < (long)uVar3);
  }
  if (*pcVar4 == ':') {
    *pcVar4 = '1';
    *decimal_point = *decimal_point + 1;
  }
  *buffer._8_8_ = count;
  return;
}

Assistant:

static void GenerateCountedDigits(int count, int* decimal_point,
                                  Bignum* numerator, Bignum* denominator,
                                  Vector<char> buffer, int* length) {
  ASSERT(count >= 0);
  for (int i = 0; i < count - 1; ++i) {
    uint16_t digit;
    digit = numerator->DivideModuloIntBignum(*denominator);
    ASSERT(digit <= 9);  // digit is a uint16_t and therefore always positive.
    // digit = numerator / denominator (integer division).
    // numerator = numerator % denominator.
    buffer[i] = static_cast<char>(digit + '0');
    // Prepare for next iteration.
    numerator->Times10();
  }
  // Generate the last digit.
  uint16_t digit;
  digit = numerator->DivideModuloIntBignum(*denominator);
  if (Bignum::PlusCompare(*numerator, *numerator, *denominator) >= 0) {
    digit++;
  }
  ASSERT(digit <= 10);
  buffer[count - 1] = static_cast<char>(digit + '0');
  // Correct bad digits (in case we had a sequence of '9's). Propagate the
  // carry until we hat a non-'9' or til we reach the first digit.
  for (int i = count - 1; i > 0; --i) {
    if (buffer[i] != '0' + 10) break;
    buffer[i] = '0';
    buffer[i - 1]++;
  }
  if (buffer[0] == '0' + 10) {
    // Propagate a carry past the top place.
    buffer[0] = '1';
    (*decimal_point)++;
  }
  *length = count;
}